

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_function.h
# Opt level: O0

void dukglue_register_function<Shape*,std::__cxx11::string_const&>
               (duk_context *ctx,
               _func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *funcToCall,char *name)

{
  duk_c_function evalFunc;
  char *name_local;
  _func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *funcToCall_local;
  duk_context *ctx_local;
  
  duk_push_c_function(ctx,dukglue::detail::
                          FuncInfoHolder<Shape_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          ::FuncRuntime::call_native_function,1);
  duk_push_pointer(ctx,funcToCall);
  duk_put_prop_string(ctx,-2,anon_var_dwarf_da7c);
  duk_put_global_string(ctx,name);
  return;
}

Assistant:

void dukglue_register_function(duk_context* ctx, RetType(*funcToCall)(Ts...), const char* name)
{
	duk_c_function evalFunc = dukglue::detail::FuncInfoHolder<RetType, Ts...>::FuncRuntime::call_native_function;

	duk_push_c_function(ctx, evalFunc, sizeof...(Ts));

  static_assert(sizeof(RetType(*)(Ts...)) == sizeof(void*), "Function pointer and data pointer are different sizes");
	duk_push_pointer(ctx, reinterpret_cast<void*>(funcToCall));
	duk_put_prop_string(ctx, -2, "\xFF" "func_ptr");

	duk_put_global_string(ctx, name);
}